

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9150::configureCompass(RTIMUMPU9150 *this)

{
  bool bVar1;
  uchar data;
  uchar regAddr;
  uchar slaveAddr;
  RTIMUSettings *pRVar2;
  char *errorMsg;
  uchar id;
  uchar asa [3];
  uchar local_d;
  ushort local_c;
  byte local_a;
  
  this->m_compassIs5883 = false;
  this->m_compassDataLength = 8;
  bypassOn(this);
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\f','\n','\0',
                             "Failed to set compass in power down mode 1");
  if ((bVar1) &&
     (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\f','\n','\x0f',
                                 "Failed to set compass in fuse ROM mode"), bVar1)) {
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\f','\x10','\x03',
                              (uchar *)&local_c,"");
    if (bVar1) {
      *(ulong *)this->m_compassAdjust =
           CONCAT44(((float)(byte)(local_c >> 8) + -128.0) * 0.00390625 + 1.0,
                    ((float)(local_c & 0xff) + -128.0) * 0.00390625 + 1.0);
      this->m_compassAdjust[2] = ((float)local_a + -128.0) * 0.00390625 + 1.0;
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\f','\n','\0',
                                 "Failed to set compass in power down mode 2");
      if (!bVar1) goto LAB_0011b1df;
    }
    else {
      bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x1e','\n','\x01'
                                ,&local_d,"Failed to find 5883");
      if ((!bVar1) || (local_d != 'H')) {
        bypassOff(this);
        puts("Detected MPU-6050 without compass");
        fflush(_stdout);
        (this->super_RTIMU).m_imuData.compassValid = false;
        return true;
      }
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x1e','\0','8',
                                 "Failed to set HMC5883 config A");
      if (((!bVar1) ||
          (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x1e',
                                      '\x01',' ',"Failed to set HMC5883 config B"), !bVar1)) ||
         (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,'\x1e','\x02'
                                     ,'\0',"Failed to set HMC5883 mode"), !bVar1))
      goto LAB_0011b1df;
      puts("Detected MPU-6050 with HMC5883");
      fflush(_stdout);
      this->m_compassDataLength = 6;
      this->m_compassIs5883 = true;
    }
    bypassOff(this);
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               '$','@',"Failed to set I2C master mode");
    if (bVar1) {
      pRVar2 = (this->super_RTIMU).m_settings;
      if (this->m_compassIs5883 == true) {
        bVar1 = RTIMUHal::HALWrite(&pRVar2->super_RTIMUHal,this->m_slaveAddr,'%',0x9e,
                                   "Failed to set slave 0 address");
        if (!bVar1) {
          return false;
        }
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'&','\x03',"Failed to set slave 0 reg");
        if (!bVar1) {
          return false;
        }
        pRVar2 = (this->super_RTIMU).m_settings;
        slaveAddr = this->m_slaveAddr;
        errorMsg = "Failed to set slave 0 ctrl";
        regAddr = '\'';
        data = 0x86;
      }
      else {
        bVar1 = RTIMUHal::HALWrite(&pRVar2->super_RTIMUHal,this->m_slaveAddr,'%',0x8c,
                                   "Failed to set slave 0 address");
        if (!bVar1) {
          return false;
        }
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'&','\x02',"Failed to set slave 0 reg");
        if (!bVar1) {
          return false;
        }
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'\'',0x88,"Failed to set slave 0 ctrl");
        if (!bVar1) {
          return false;
        }
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'(','\f',"Failed to set slave 1 address");
        if (!bVar1) {
          return false;
        }
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,')','\n',"Failed to set slave 1 reg");
        if (!bVar1) {
          return false;
        }
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'*',0x81,"Failed to set slave 1 ctrl");
        if (!bVar1) {
          return false;
        }
        pRVar2 = (this->super_RTIMU).m_settings;
        slaveAddr = this->m_slaveAddr;
        errorMsg = "Failed to set slave 1 DO";
        regAddr = 'd';
        data = '\x01';
      }
      bVar1 = RTIMUHal::HALWrite(&pRVar2->super_RTIMUHal,slaveAddr,regAddr,data,errorMsg);
      if (((bVar1) &&
          (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                      this->m_slaveAddr,'g','\x03',"Failed to set mst delay"), bVar1
          )) && (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                            this->m_slaveAddr,'\x01',0x80,"Failed to set yg offs tc"
                                           ), bVar1)) {
        bVar1 = setCompassRate(this);
        return bVar1;
      }
    }
  }
  else {
LAB_0011b1df:
    bypassOff(this);
  }
  return false;
}

Assistant:

bool RTIMUMPU9150::configureCompass()
{
    unsigned char asa[3];
    unsigned char id;

    m_compassIs5883 = false;
    m_compassDataLength = 8;

    bypassOn();

    // get fuse ROM data

    if (!m_settings->HALWrite(AK8975_ADDRESS, AK8975_CNTL, 0, "Failed to set compass in power down mode 1")) {
        bypassOff();
        return false;
    }

    if (!m_settings->HALWrite(AK8975_ADDRESS, AK8975_CNTL, 0x0f, "Failed to set compass in fuse ROM mode")) {
        bypassOff();
        return false;
    }

    if (!m_settings->HALRead(AK8975_ADDRESS, AK8975_ASAX, 3, asa, "")) {

        //  check to see if an HMC5883L is fitted

        if (!m_settings->HALRead(HMC5883_ADDRESS, HMC5883_ID, 1, &id, "Failed to find 5883")) {
            bypassOff();

            //  this is returning true so that MPU-6050 by itself will work

            HAL_INFO("Detected MPU-6050 without compass\n");

            m_imuData.compassValid = false;
            return true;
        }
        if (id != 0x48) {                                   // incorrect id for HMC5883L

            bypassOff();

            //  this is returning true so that MPU-6050 by itself will work

            HAL_INFO("Detected MPU-6050 without compass\n");

            m_imuData.compassValid = false;
            return true;
        }

        // HMC5883 is present - use that

        if (!m_settings->HALWrite(HMC5883_ADDRESS, HMC5883_CONFIG_A, 0x38, "Failed to set HMC5883 config A")) {
            bypassOff();
            return false;
        }

        if (!m_settings->HALWrite(HMC5883_ADDRESS, HMC5883_CONFIG_B, 0x20, "Failed to set HMC5883 config B")) {
            bypassOff();
            return false;
        }

        if (!m_settings->HALWrite(HMC5883_ADDRESS, HMC5883_MODE, 0x00, "Failed to set HMC5883 mode")) {
            bypassOff();
            return false;
        }

        HAL_INFO("Detected MPU-6050 with HMC5883\n");

        m_compassDataLength = 6;
        m_compassIs5883 = true;
    } else {

        //  convert asa to usable scale factor

        m_compassAdjust[0] = ((float)asa[0] - 128.0) / 256.0 + 1.0f;
        m_compassAdjust[1] = ((float)asa[1] - 128.0) / 256.0 + 1.0f;
        m_compassAdjust[2] = ((float)asa[2] - 128.0) / 256.0 + 1.0f;

        if (!m_settings->HALWrite(AK8975_ADDRESS, AK8975_CNTL, 0, "Failed to set compass in power down mode 2")) {
            bypassOff();
            return false;
        }
    }

    bypassOff();

    //  now set up MPU9150 to talk to the compass chip

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_MST_CTRL, 0x40, "Failed to set I2C master mode"))
        return false;

    if (m_compassIs5883) {
        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV0_ADDR, 0x80 | HMC5883_ADDRESS, "Failed to set slave 0 address"))
                return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV0_REG, HMC5883_DATA_X_HI, "Failed to set slave 0 reg"))
            return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV0_CTRL, 0x86, "Failed to set slave 0 ctrl"))
            return false;
    } else {
        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV0_ADDR, 0x80 | AK8975_ADDRESS, "Failed to set slave 0 address"))
                return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV0_REG, AK8975_ST1, "Failed to set slave 0 reg"))
            return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV0_CTRL, 0x88, "Failed to set slave 0 ctrl"))
            return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV1_ADDR, AK8975_ADDRESS, "Failed to set slave 1 address"))
            return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV1_REG, AK8975_CNTL, "Failed to set slave 1 reg"))
            return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV1_CTRL, 0x81, "Failed to set slave 1 ctrl"))
            return false;

        if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV1_DO, 0x1, "Failed to set slave 1 DO"))
            return false;

    }

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_MST_DELAY_CTRL, 0x3, "Failed to set mst delay"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_YG_OFFS_TC, 0x80, "Failed to set yg offs tc"))
        return false;

    if (!setCompassRate())
        return false;

    return true;
}